

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O1

int blake2b_init_param(blake2b_state *S,blake2b_param *P)

{
  ulong *puVar1;
  uint64_t uVar2;
  long lVar3;
  
  lVar3 = 0;
  memset(S->t,0,0x140);
  S->h[0] = 0x6a09e667f3bcc908;
  S->h[1] = 0xbb67ae8584caa73b;
  S->h[2] = 0x3c6ef372fe94f82b;
  S->h[3] = 0xa54ff53a5f1d36f1;
  S->h[4] = 0x510e527fade682d1;
  S->h[5] = 0x9b05688c2b3e6c1f;
  S->h[6] = 0x1f83d9abfb41bd6b;
  S->h[7] = 0x5be0cd19137e2179;
  do {
    uVar2 = load64(P->reserved + lVar3 + -0x12);
    puVar1 = (ulong *)((long)S->h + lVar3);
    *puVar1 = *puVar1 ^ uVar2;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x40);
  return 0;
}

Assistant:

int blake2b_init_param( blake2b_state *S, const blake2b_param *P )
{
    size_t i;
    uint8_t *p;

  blake2b_init0( S );
    p = ( uint8_t * )( P );

  /* IV XOR ParamBlock */
  for( i = 0; i < 8; ++i )
    S->h[i] ^= load64( p + sizeof( S->h[i] ) * i );

  return 0;
}